

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDEdgePtr::SetRelativeSharpness(ON_SubDEdgePtr *this,ON_SubDEdgeSharpness relative_sharpness)

{
  ON_SubDEdge *this_00;
  ON_SubDEdgeSharpness local_28;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr *this_local;
  ON_SubDEdgeSharpness relative_sharpness_local;
  
  this_00 = (ON_SubDEdge *)(this->m_ptr & 0xfffffffffffffff8);
  if (this_00 != (ON_SubDEdge *)0x0) {
    local_28.m_edge_sharpness = relative_sharpness.m_edge_sharpness;
    this_local = (ON_SubDEdgePtr *)relative_sharpness.m_edge_sharpness;
    if ((this->m_ptr & 1) != 0) {
      local_28 = ON_SubDEdgeSharpness::Reversed((ON_SubDEdgeSharpness *)&this_local);
    }
    ON_SubDEdge::SetSharpnessForExperts(this_00,local_28);
  }
  return;
}

Assistant:

void ON_SubDEdgePtr::SetRelativeSharpness(ON_SubDEdgeSharpness relative_sharpness) const
{
  ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr != edge)
    edge->SetSharpnessForExperts(
      (0 == ON_SUBD_EDGE_DIRECTION(m_ptr))
      ? relative_sharpness 
      : relative_sharpness.Reversed()
    );
}